

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-alloc.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  bool bVar2;
  int iVar3;
  time_t tVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  gpt2_model *model_00;
  ggml_gallocr_t allocr_00;
  int *piVar9;
  mt19937 *embd_inp_00;
  vector<float,_std::allocator<float>_> *embd_w;
  size_type sVar10;
  int *piVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar15;
  key_type *pkVar16;
  reference pvVar17;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar18;
  undefined1 auVar19 [16];
  int64_t t_main_end_us;
  int id_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t k;
  int64_t t_start_sample_us;
  id id;
  int n_vocab;
  float temp;
  float top_p;
  int top_k;
  int64_t t_start_us_1;
  size_t i_1;
  vector<int,_std::allocator<int>_> embd;
  int i;
  vector<int,_std::allocator<int>_> embd_inp;
  vector<float,_std::allocator<float>_> logits;
  int64_t t_predict_us;
  int64_t t_sample_us;
  int n_past;
  size_t mem_size;
  ggml_cgraph *gf;
  int n_past_1;
  int n_tokens;
  ggml_gallocr_t allocr;
  int64_t t_start_us;
  gpt2_model model;
  gpt_vocab vocab;
  int64_t t_load_us;
  mt19937 rng;
  gpt_params params;
  int64_t t_main_start_us;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe888;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe890;
  mapped_type *in_stack_ffffffffffffe898;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe8a0;
  key_type *in_stack_ffffffffffffe8c8;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  undefined7 in_stack_ffffffffffffe8e0;
  undefined1 in_stack_ffffffffffffe8e7;
  mt19937 *in_stack_ffffffffffffe918;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe988;
  gpt_vocab *in_stack_ffffffffffffe990;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1668;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1638;
  vector<int,_std::allocator<int>_> local_1630;
  int local_1618 [4];
  vector<int,_std::allocator<int>_> local_1608;
  vector<float,_std::allocator<float>_> local_15f0;
  long local_15d8;
  long local_15d0;
  int local_15c4;
  vector<float,_std::allocator<float>_> *local_15c0;
  mt19937 *rng_00;
  int iVar20;
  ggml_gallocr_t top_p_00;
  undefined4 in_stack_ffffffffffffea68;
  int in_stack_ffffffffffffea6c;
  int iVar21;
  gpt_vocab *in_stack_ffffffffffffea70;
  undefined8 local_1528;
  string *in_stack_ffffffffffffeb10;
  gpt_vocab *in_stack_ffffffffffffeb18;
  int in_stack_ffffffffffffeb78;
  int in_stack_ffffffffffffeb7c;
  gpt2_model *in_stack_ffffffffffffeb80;
  string local_1470 [576];
  gpt_params *in_stack_ffffffffffffedd0;
  char **in_stack_ffffffffffffedd8;
  int in_stack_ffffffffffffede4;
  gpt_vocab *in_stack_fffffffffffff608;
  gpt2_model *in_stack_fffffffffffff610;
  string *in_stack_fffffffffffff618;
  uint local_b8;
  int local_b0 [2];
  int local_a8 [10];
  string local_80 [32];
  string local_60 [72];
  long local_18;
  int local_4;
  
  local_4 = 0;
  ggml_time_init();
  local_18 = ggml_time_us();
  gpt_params::gpt_params
            ((gpt_params *)CONCAT17(in_stack_ffffffffffffe8e7,in_stack_ffffffffffffe8e0));
  std::__cxx11::string::operator=(local_80,"models/gpt-2-117M/ggml-model.bin");
  bVar2 = gpt_params_parse(in_stack_ffffffffffffede4,in_stack_ffffffffffffedd8,
                           in_stack_ffffffffffffedd0);
  if (bVar2) {
    if ((int)local_b8 < 0) {
      tVar4 = time((time_t *)0x0);
      local_b8 = (uint)tVar4;
    }
    printf("%s: seed = %d\n","main",(ulong)local_b8);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(in_stack_ffffffffffffe890,(result_type)in_stack_ffffffffffffe888);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      gpt_random_prompt_abi_cxx11_(in_stack_ffffffffffffe918);
      std::__cxx11::string::operator=(local_60,local_1470);
      std::__cxx11::string::~string(local_1470);
    }
    gpt_vocab::gpt_vocab((gpt_vocab *)in_stack_ffffffffffffe890);
    gpt2_model::gpt2_model((gpt2_model *)in_stack_ffffffffffffe890);
    lVar6 = ggml_time_us();
    bVar2 = gpt2_model_load(in_stack_fffffffffffff618,in_stack_fffffffffffff610,
                            in_stack_fffffffffffff608);
    __stream = _stderr;
    if (bVar2) {
      lVar8 = ggml_time_us();
      lVar8 = lVar8 - lVar6;
      test_gpt_tokenizer(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988._M_current);
      model_00 = (gpt2_model *)ggml_backend_cpu_buffer_type();
      allocr_00 = (ggml_gallocr_t)ggml_gallocr_new(model_00);
      top_p_00 = allocr_00;
      piVar9 = std::min<int>((int *)&stack0xffffffffffffea6c,local_a8);
      iVar20 = *piVar9;
      iVar3 = in_stack_ffffffffffffea6c - iVar20;
      embd_inp_00 = (mt19937 *)
                    gpt2_graph(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb7c,
                               in_stack_ffffffffffffeb78);
      rng_00 = embd_inp_00;
      ggml_gallocr_reserve(top_p_00,embd_inp_00);
      embd_w = (vector<float,_std::allocator<float>_> *)ggml_gallocr_get_buffer_size(top_p_00,0);
      auVar19._8_4_ = (int)((ulong)embd_w >> 0x20);
      auVar19._0_8_ = embd_w;
      auVar19._12_4_ = 0x45300000;
      local_15c0 = embd_w;
      fprintf(_stderr,"%s: compute buffer size: %.2f MB\n",
              ((auVar19._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)embd_w) - 4503599627370496.0)) * 0.0009765625 *
              0.0009765625,"main");
      local_15c4 = 0;
      local_15d0 = 0;
      local_15d8 = 0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x115a6b);
      gpt_tokenize(in_stack_ffffffffffffeb18,in_stack_ffffffffffffeb10);
      iVar21 = in_stack_ffffffffffffea6c;
      sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_1608);
      local_1618[3] = in_stack_ffffffffffffea6c - (int)sVar10;
      piVar11 = std::min<int>(local_b0,local_1618 + 3);
      local_b0[0] = *piVar11;
      uVar7 = std::__cxx11::string::c_str();
      printf("%s: prompt: \'%s\'\n","main",uVar7);
      sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_1608);
      printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",sVar10);
      local_1618[2] = 0;
      while( true ) {
        iVar1 = local_1618[2];
        local_1618[1] = 8;
        sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_1608);
        local_1618[0] = (int)sVar10;
        piVar11 = std::min<int>(local_1618 + 1,local_1618);
        if (*piVar11 <= iVar1) break;
        puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_1608,(long)local_1618[2]);
        printf("%d ",(ulong)*puVar12);
        local_1618[2] = local_1618[2] + 1;
      }
      printf("\n\n");
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x115c32);
      for (local_1638 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)std::vector<int,_std::allocator<int>_>::size(&local_1630);
          sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_1608),
          local_1638 <
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)(sVar10 + (long)local_b0[0]);
          local_1638 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&(local_1638->_M_t)._M_impl.field_0x1) {
        sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_1630);
        if (sVar10 != 0) {
          lVar13 = ggml_time_us();
          bVar2 = gpt2_eval(model_00,allocr_00,(int)((ulong)piVar9 >> 0x20),(int)piVar9,
                            (vector<int,_std::allocator<int>_> *)embd_inp_00,embd_w);
          if (!bVar2) {
            printf("Failed to predict\n");
            local_4 = 1;
            goto LAB_001161ca;
          }
          lVar14 = ggml_time_us();
          local_15d8 = (lVar14 - lVar13) + local_15d8;
        }
        sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_1630);
        local_15c4 = local_15c4 + (int)sVar10;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x115d99)
        ;
        this = local_1638;
        pmVar15 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)std::vector<int,_std::allocator<int>_>::size(&local_1608);
        if (this < pmVar15) {
          local_1668 = local_1638;
          while (in_stack_ffffffffffffe8a0 = local_1668,
                pmVar15 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)std::vector<int,_std::allocator<int>_>::size(&local_1608),
                in_stack_ffffffffffffe8a0 < pmVar15) {
            std::vector<int,_std::allocator<int>_>::operator[](&local_1608,(size_type)local_1668);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe8a0,
                       (value_type_conflict3 *)in_stack_ffffffffffffe898);
            sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_1630);
            if (local_a8[0] <= (int)sVar10) break;
            local_1668 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&(local_1668->_M_t)._M_impl.field_0x1;
          }
          sVar10 = std::vector<int,_std::allocator<int>_>::size(&local_1630);
          local_1638 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((sVar10 - 1) + (long)local_1638);
        }
        else {
          pkVar16 = (key_type *)ggml_time_us();
          in_stack_ffffffffffffe8c8 = pkVar16;
          std::vector<float,_std::allocator<float>_>::data
                    ((vector<float,_std::allocator<float>_> *)0x115e3a);
          std::vector<float,_std::allocator<float>_>::size(&local_15f0);
          gpt_sample_top_k_top_p
                    (in_stack_ffffffffffffea70,(float *)CONCAT44(iVar21,in_stack_ffffffffffffea68),
                     (int)((ulong)lVar6 >> 0x20),(double)top_p_00,(double)CONCAT44(iVar20,iVar3),
                     rng_00);
          lVar13 = ggml_time_us();
          local_15d0 = local_15d0 + (lVar13 - (long)pkVar16);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe8a0,
                     (value_type_conflict3 *)in_stack_ffffffffffffe898);
        }
        std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffe888);
        std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffe888);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffe890,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffe888), bVar2) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &stack0xffffffffffffe988);
          in_stack_ffffffffffffe898 =
               std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this,in_stack_ffffffffffffe8c8);
          uVar7 = std::__cxx11::string::c_str();
          printf("%s",uVar7);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &stack0xffffffffffffe988);
        }
        fflush(_stdout);
        pvVar17 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe890);
        if (*pvVar17 == 0xc450) break;
      }
      pmVar18 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *)ggml_time_us();
      in_stack_ffffffffffffe890 = pmVar18;
      printf("\n\n");
      printf("%s:     load time = %8.2f ms\n",(double)((float)lVar8 / 1000.0),"main");
      printf("%s:   sample time = %8.2f ms\n",(double)((float)local_15d0 / 1000.0),"main");
      printf("%s:  predict time = %8.2f ms / %.2f ms per token\n",
             (double)((float)local_15d8 / 1000.0),
             (double)(((float)local_15d8 / 1000.0) / (float)local_15c4),"main");
      printf("%s:    total time = %8.2f ms\n",(double)((float)((long)pmVar18 - local_18) / 1000.0),
             "main");
      ggml_free(local_1528);
      local_4 = 0;
LAB_001161ca:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe8a0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe8a0);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe8a0);
    }
    else {
      uVar7 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s: failed to load model from \'%s\'\n","main",uVar7);
      local_4 = 1;
    }
    gpt2_model::~gpt2_model((gpt2_model *)in_stack_ffffffffffffe890);
    gpt_vocab::~gpt_vocab((gpt_vocab *)in_stack_ffffffffffffe890);
  }
  else {
    local_4 = 1;
  }
  gpt_params::~gpt_params((gpt_params *)in_stack_ffffffffffffe890);
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;
    params.model = "models/gpt-2-117M/ggml-model.bin";

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    ggml_gallocr_t allocr = NULL;
    // allocate the compute buffer
    {
        allocr = ggml_gallocr_new(ggml_backend_cpu_buffer_type());

        // create the worst case graph for memory usage estimation
        int n_tokens = std::min(model.hparams.n_ctx, params.n_batch);
        int n_past = model.hparams.n_ctx - n_tokens;
        struct ggml_cgraph * gf = gpt2_graph(model, n_past, n_tokens);

        // pre-allocate the compute buffer for the worst case (optional)
        ggml_gallocr_reserve(allocr, gf);
        size_t mem_size =  ggml_gallocr_get_buffer_size(allocr, 0);
        fprintf(stderr, "%s: compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    // submit the input prompt token-by-token
    // this reduces the memory usage during inference, at the cost of a bit of speed at the beginning
    std::vector<gpt_vocab::id> embd;

    for (size_t i = embd.size(); i < embd_inp.size() + params.n_predict; i++) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!gpt2_eval(model, allocr, params.n_threads, n_past, embd, logits)) {
                printf("Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (i >= embd_inp.size()) {
            // sample next token
            const int   top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits.data() + (logits.size() - n_vocab), top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);
        } else {
            // if here, it means we are still processing the input prompt
            for (size_t k = i; k < embd_inp.size(); k++) {
                embd.push_back(embd_inp[k]);
                if (int32_t(embd.size()) >= params.n_batch) {
                    break;
                }
            }
            i += embd.size() - 1;
        }

        // display text
        for (auto id : embd) {
            printf("%s", vocab.id_to_token[id].c_str());
        }
        fflush(stdout);

        // end of text token
        if (embd.back() == 50256) {
            break;
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx_w);

    return 0;
}